

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O2

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::find
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,uint64_t time_reference,
          CInput *t)

{
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *ptVar1;
  iterator iVar2;
  iterator local_28;
  
  this->time_reference = time_reference;
  local_28._cell = (this->super_list<r_exec::CInput>).used_cells_head;
  local_28.buffer = this;
  while ((ptVar1 = time_buffer<r_exec::CInput,r_exec::CInput::IsInvalidated>::end_iterator,
         local_28._cell != _DAT_001d7e90 &&
         (ptVar1 = local_28.buffer,
         *(_Object **)
          ((long)(((local_28.buffer)->super_list<r_exec::CInput>).cells.
                  super__Vector_base<r_code::list<r_exec::CInput>::cell,_std::allocator<r_code::list<r_exec::CInput>::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_28._cell) + 0x20) !=
         (t->input).object))) {
    iterator::operator++(&local_28);
  }
  iVar2._cell = local_28._cell;
  iVar2.buffer = ptVar1;
  return iVar2;
}

Assistant:

iterator find(uint64_t time_reference, const T &t)
    {
        iterator i;

        for (i = begin(time_reference); i != end(); ++i) {
            if ((*i) == t) {
                return i;
            }
        }

        return end_iterator;
    }